

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O0

void __thiscall
dynet::FastLSTMBuilder::FastLSTMBuilder
          (FastLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  initializer_list<dynet::Parameter> __l;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  Parameter PVar1;
  Parameter __x;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  Parameter p_bc;
  Parameter p_h2c;
  Parameter p_x2c;
  Parameter p_bo;
  Parameter p_c2o;
  Parameter p_h2o;
  Parameter p_x2o;
  Parameter p_bi;
  Parameter p_c2i;
  Parameter p_h2i;
  Parameter p_x2i;
  uint i;
  uint layer_input_dim;
  undefined4 in_stack_fffffffffffff818;
  float in_stack_fffffffffffff81c;
  ParameterCollection *in_stack_fffffffffffff820;
  allocator *this_00;
  allocator *__a;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *this_01;
  ParameterCollection *in_stack_fffffffffffff860;
  allocator *paVar2;
  Device *in_stack_fffffffffffff878;
  string *in_stack_fffffffffffff880;
  Parameter in_stack_fffffffffffff888;
  float scale;
  Dim *in_stack_fffffffffffff890;
  ParameterCollection *in_stack_fffffffffffff898;
  ParameterStorage *local_678;
  ParameterStorage *local_670;
  ParameterStorage *local_668;
  ParameterStorage *local_660;
  ParameterStorage *local_658;
  ParameterStorage *local_650;
  ParameterStorage *local_648;
  ParameterStorage *local_640;
  ParameterStorage *local_638;
  ParameterStorage *local_630;
  ParameterStorage *local_628;
  ParameterStorage **local_620;
  undefined8 local_618;
  Dim *in_stack_fffffffffffffa00;
  ParameterCollection *in_stack_fffffffffffffa08;
  size_type in_stack_fffffffffffffa10;
  Device *in_stack_fffffffffffffa18;
  string *in_stack_fffffffffffffa20;
  ParameterInit *in_stack_fffffffffffffa28;
  Dim *in_stack_fffffffffffffa30;
  ParameterCollection *in_stack_fffffffffffffa38;
  undefined4 local_5bc;
  undefined4 *local_5b8;
  undefined8 local_5b0;
  ParameterStorage *local_580;
  allocator local_571;
  string local_570 [32];
  undefined4 local_550 [2];
  undefined4 *local_548;
  undefined8 local_540;
  ParameterStorage *local_510;
  allocator local_501;
  string local_500 [32];
  undefined4 local_4e0 [2];
  undefined4 *local_4d8;
  undefined8 local_4d0;
  ParameterStorage *local_4a0;
  undefined1 local_491 [53];
  undefined4 local_45c;
  undefined4 *local_458;
  undefined8 local_450;
  ParameterStorage *local_420;
  undefined1 local_411 [33];
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 *local_3e8;
  undefined8 local_3e0;
  ParameterStorage *local_3b0;
  allocator local_3a1;
  string local_3a0 [32];
  undefined4 local_380 [2];
  undefined4 *local_378;
  undefined8 local_370;
  ParameterStorage *local_340;
  allocator local_331;
  string local_330 [32];
  undefined4 local_310 [2];
  undefined4 *local_308;
  undefined8 local_300;
  ParameterStorage *local_2d0;
  allocator local_2c1;
  string local_2c0 [52];
  undefined4 local_28c;
  undefined4 *local_288;
  undefined8 local_280;
  ParameterStorage *local_250;
  allocator local_241;
  string local_240 [32];
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 *local_218;
  undefined8 local_210;
  ParameterStorage *local_1e0;
  allocator local_1d1;
  string local_1d0 [32];
  undefined4 local_1b0 [2];
  undefined4 *local_1a8;
  undefined8 local_1a0;
  ParameterStorage *local_170;
  allocator local_161;
  string local_160 [32];
  undefined4 local_140 [2];
  undefined4 *local_138;
  undefined8 local_130;
  ParameterStorage *local_100;
  uint local_f8;
  allocator local_f1;
  string local_f0 [228];
  uint local_c;
  
  local_f0._220_4_ = in_ECX;
  local_f0._224_4_ = in_EDX;
  local_c = in_ESI;
  RNNBuilder::RNNBuilder((RNNBuilder *)in_stack_fffffffffffff820);
  *in_RDI = &PTR__FastLSTMBuilder_010440c0;
  ParameterCollection::ParameterCollection(in_stack_fffffffffffff860);
  std::
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ::vector((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            *)0x965276);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
            *)0x965292);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
            *)0x9652ae);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
            *)0x9652ca);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0x9652e6);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0x965302);
  *(uint *)(in_RDI + 0x2d) = local_c;
  local_f0[0xc0] = local_f0[0xe0];
  local_f0[0xc1] = local_f0[0xe1];
  local_f0[0xc2] = local_f0[0xe2];
  local_f0[0xc3] = local_f0[0xe3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"fast-lstm-builder",&local_f1);
  ParameterCollection::add_subcollection
            (in_stack_fffffffffffffa08,(string *)in_stack_fffffffffffffa00);
  ParameterCollection::operator=
            (in_stack_fffffffffffff820,
             (ParameterCollection *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  ParameterCollection::~ParameterCollection(in_stack_fffffffffffff820);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  for (local_f8 = 0; scale = (float)((ulong)in_stack_fffffffffffff888.p >> 0x20), local_f8 < local_c
      ; local_f8 = local_f8 + 1) {
    local_140[0]._0_1_ = local_f0[0xdc];
    local_140[0]._1_1_ = local_f0[0xdd];
    local_140[0]._2_1_ = local_f0[0xde];
    local_140[0]._3_1_ = local_f0[0xdf];
    local_140[1]._0_1_ = local_f0[0xc0];
    local_140[1]._1_1_ = local_f0[0xc1];
    local_140[1]._2_1_ = local_f0[0xc2];
    local_140[1]._3_1_ = local_f0[0xc3];
    local_138 = local_140;
    local_130 = 2;
    x._M_len = in_stack_fffffffffffffa10;
    x._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"",&local_161);
    local_100 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffff898,in_stack_fffffffffffff890,scale,
                           in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    local_1b0[0]._0_1_ = local_f0[0xdc];
    local_1b0[0]._1_1_ = local_f0[0xdd];
    local_1b0[0]._2_1_ = local_f0[0xde];
    local_1b0[0]._3_1_ = local_f0[0xdf];
    local_1b0[1]._0_1_ = local_f0[0xdc];
    local_1b0[1]._1_1_ = local_f0[0xdd];
    local_1b0[1]._2_1_ = local_f0[0xde];
    local_1b0[1]._3_1_ = local_f0[0xdf];
    local_1a8 = local_1b0;
    local_1a0 = 2;
    x_00._M_len = in_stack_fffffffffffffa10;
    x_00._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"",&local_1d1);
    local_170 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffff898,in_stack_fffffffffffff890,scale,
                           in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    local_220._0_1_ = local_f0[0xdc];
    local_220._1_1_ = local_f0[0xdd];
    local_220._2_1_ = local_f0[0xde];
    local_220._3_1_ = local_f0[0xdf];
    local_21c = 1;
    local_218 = &local_220;
    local_210 = 2;
    x_01._M_len = in_stack_fffffffffffffa10;
    x_01._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"",&local_241);
    local_1e0 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffff898,in_stack_fffffffffffff890,scale,
                           in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    local_28c._0_1_ = local_f0[0xdc];
    local_28c._1_1_ = local_f0[0xdd];
    local_28c._2_1_ = local_f0[0xde];
    local_28c._3_1_ = local_f0[0xdf];
    local_288 = &local_28c;
    local_280 = 1;
    x_02._M_len = in_stack_fffffffffffffa10;
    x_02._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x_02);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"",&local_2c1);
    local_250 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                           in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                           in_stack_fffffffffffffa18);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0x9657eb);
    local_310[0]._0_1_ = local_f0[0xdc];
    local_310[0]._1_1_ = local_f0[0xdd];
    local_310[0]._2_1_ = local_f0[0xde];
    local_310[0]._3_1_ = local_f0[0xdf];
    local_310[1]._0_1_ = local_f0[0xc0];
    local_310[1]._1_1_ = local_f0[0xc1];
    local_310[1]._2_1_ = local_f0[0xc2];
    local_310[1]._3_1_ = local_f0[0xc3];
    local_308 = local_310;
    local_300 = 2;
    x_03._M_len = in_stack_fffffffffffffa10;
    x_03._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x_03);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"",&local_331);
    local_2d0 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffff898,in_stack_fffffffffffff890,scale,
                           in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    local_380[0]._0_1_ = local_f0[0xdc];
    local_380[0]._1_1_ = local_f0[0xdd];
    local_380[0]._2_1_ = local_f0[0xde];
    local_380[0]._3_1_ = local_f0[0xdf];
    local_380[1]._0_1_ = local_f0[0xdc];
    local_380[1]._1_1_ = local_f0[0xdd];
    local_380[1]._2_1_ = local_f0[0xde];
    local_380[1]._3_1_ = local_f0[0xdf];
    local_378 = local_380;
    local_370 = 2;
    x_04._M_len = in_stack_fffffffffffffa10;
    x_04._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x_04);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a0,"",&local_3a1);
    local_340 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffff898,in_stack_fffffffffffff890,scale,
                           in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    std::__cxx11::string::~string(local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    in_stack_fffffffffffff898 = (ParameterCollection *)(in_RDI + 6);
    local_3f0._0_1_ = local_f0[0xdc];
    local_3f0._1_1_ = local_f0[0xdd];
    local_3f0._2_1_ = local_f0[0xde];
    local_3f0._3_1_ = local_f0[0xdf];
    local_3ec = 1;
    local_3e8 = &local_3f0;
    local_3e0 = 2;
    x_05._M_len = in_stack_fffffffffffffa10;
    x_05._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x_05);
    in_stack_fffffffffffff890 = (Dim *)local_411;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_411 + 1),"",(allocator *)in_stack_fffffffffffff890);
    in_stack_fffffffffffff888 =
         ParameterCollection::add_parameters
                   (in_stack_fffffffffffff898,in_stack_fffffffffffff890,scale,
                    in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    local_3b0 = in_stack_fffffffffffff888.p;
    std::__cxx11::string::~string((string *)(local_411 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_411);
    in_stack_fffffffffffff880 = (string *)(in_RDI + 6);
    local_45c._0_1_ = local_f0[0xdc];
    local_45c._1_1_ = local_f0[0xdd];
    local_45c._2_1_ = local_f0[0xde];
    local_45c._3_1_ = local_f0[0xdf];
    local_458 = &local_45c;
    local_450 = 1;
    x_06._M_len = in_stack_fffffffffffffa10;
    x_06._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x_06);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
    in_stack_fffffffffffff878 = (Device *)local_491;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_491 + 1),"",(allocator *)in_stack_fffffffffffff878);
    local_420 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                           in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                           in_stack_fffffffffffffa18);
    std::__cxx11::string::~string((string *)(local_491 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_491);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0x965bd0);
    local_4e0[0]._0_1_ = local_f0[0xdc];
    local_4e0[0]._1_1_ = local_f0[0xdd];
    local_4e0[0]._2_1_ = local_f0[0xde];
    local_4e0[0]._3_1_ = local_f0[0xdf];
    local_4e0[1]._0_1_ = local_f0[0xc0];
    local_4e0[1]._1_1_ = local_f0[0xc1];
    local_4e0[1]._2_1_ = local_f0[0xc2];
    local_4e0[1]._3_1_ = local_f0[0xc3];
    local_4d8 = local_4e0;
    local_4d0 = 2;
    x_07._M_len = in_stack_fffffffffffffa10;
    x_07._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x_07);
    paVar2 = &local_501;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_500,"",paVar2);
    PVar1 = ParameterCollection::add_parameters
                      (in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                       (float)((ulong)in_stack_fffffffffffff888.p >> 0x20),in_stack_fffffffffffff880
                       ,in_stack_fffffffffffff878);
    local_4a0 = PVar1.p;
    std::__cxx11::string::~string(local_500);
    std::allocator<char>::~allocator((allocator<char> *)&local_501);
    this_01 = (vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)(in_RDI + 6);
    local_550[0]._0_1_ = local_f0[0xdc];
    local_550[0]._1_1_ = local_f0[0xdd];
    local_550[0]._2_1_ = local_f0[0xde];
    local_550[0]._3_1_ = local_f0[0xdf];
    local_550[1]._0_1_ = local_f0[0xdc];
    local_550[1]._1_1_ = local_f0[0xdd];
    local_550[1]._2_1_ = local_f0[0xde];
    local_550[1]._3_1_ = local_f0[0xdf];
    local_548 = local_550;
    local_540 = 2;
    x_08._M_len = in_stack_fffffffffffffa10;
    x_08._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x_08);
    __a = &local_571;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_570,"",__a);
    local_510 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                           (float)((ulong)in_stack_fffffffffffff888.p >> 0x20),
                           in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    std::__cxx11::string::~string(local_570);
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
    local_5bc._0_1_ = local_f0[0xdc];
    local_5bc._1_1_ = local_f0[0xdd];
    local_5bc._2_1_ = local_f0[0xde];
    local_5bc._3_1_ = local_f0[0xdf];
    local_5b8 = &local_5bc;
    local_5b0 = 1;
    x_09._M_len = in_stack_fffffffffffffa10;
    x_09._M_array = (iterator)in_stack_fffffffffffffa08;
    Dim::Dim(in_stack_fffffffffffffa00,x_09);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
    this_00 = (allocator *)&stack0xfffffffffffffa0f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffa10,"",this_00);
    __x = ParameterCollection::add_parameters
                    (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                     in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    local_580 = __x.p;
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffa10);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa0f);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0x965ea4);
    local_f0[0xc0] = local_f0[0xdc];
    local_f0[0xc1] = local_f0[0xdd];
    local_f0[0xc2] = local_f0[0xde];
    local_f0[0xc3] = local_f0[0xdf];
    local_678 = local_100;
    local_670 = local_170;
    local_668 = local_1e0;
    local_660 = local_250;
    local_658 = local_2d0;
    local_650 = local_340;
    local_648 = local_3b0;
    local_640 = local_420;
    local_638 = local_4a0;
    local_630 = local_510;
    local_628 = local_580;
    local_620 = &local_678;
    local_618 = 0xb;
    in_stack_fffffffffffff820 = (ParameterCollection *)&stack0xfffffffffffff987;
    std::allocator<dynet::Parameter>::allocator((allocator<dynet::Parameter> *)0x965f90);
    __l._M_len = (size_type)paVar2;
    __l._M_array = (iterator)PVar1.p;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
              (this_01,__l,(allocator_type *)__a);
    std::allocator<dynet::Parameter>::~allocator((allocator<dynet::Parameter> *)0x965fc1);
    std::
    vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
    ::push_back((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                 *)this_00,(value_type *)__x.p);
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~vector
              ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)this_00);
  }
  return;
}

Assistant:

FastLSTMBuilder::FastLSTMBuilder(unsigned layers,
                                 unsigned input_dim,
                                 unsigned hidden_dim,
                                 ParameterCollection& model) : layers(layers) {
  unsigned layer_input_dim = input_dim;
  local_model = model.add_subcollection("fast-lstm-builder");
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameter p_x2i = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2i = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_c2i = local_model.add_parameters({hidden_dim, 1});
    Parameter p_bi = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // o
    Parameter p_x2o = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2o = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_c2o = local_model.add_parameters({hidden_dim, 1});
    Parameter p_bo = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // c
    Parameter p_x2c = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2c = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bc = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2i, p_h2i, p_c2i, p_bi, p_x2o, p_h2o, p_c2o, p_bo, p_x2c, p_h2c, p_bc};
    params.push_back(ps);
  }  // layers
}